

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeop.cc
# Opt level: O0

void __thiscall TypeOpFloatAbs::TypeOpFloatAbs(TypeOpFloatAbs *this,TypeFactory *t,Translate *trans)

{
  OpBehaviorFloatAbs *this_00;
  allocator local_41;
  string local_40 [32];
  Translate *local_20;
  Translate *trans_local;
  TypeFactory *t_local;
  TypeOpFloatAbs *this_local;
  
  local_20 = trans;
  trans_local = (Translate *)t;
  t_local = (TypeFactory *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"ABS",&local_41);
  TypeOpFunc::TypeOpFunc
            (&this->super_TypeOpFunc,t,CPUI_FLOAT_ABS,(string *)local_40,TYPE_FLOAT,TYPE_FLOAT);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  (this->super_TypeOpFunc).super_TypeOp._vptr_TypeOp = (_func_int **)&PTR_setMetatypeIn_0084cd80;
  (this->super_TypeOpFunc).super_TypeOp.opflags = 0x48000;
  this_00 = (OpBehaviorFloatAbs *)operator_new(0x18);
  OpBehaviorFloatAbs::OpBehaviorFloatAbs(this_00,local_20);
  (this->super_TypeOpFunc).super_TypeOp.behave = (OpBehavior *)this_00;
  return;
}

Assistant:

TypeOpFloatAbs::TypeOpFloatAbs(TypeFactory *t,const Translate *trans)
  : TypeOpFunc(t,CPUI_FLOAT_ABS,"ABS",TYPE_FLOAT,TYPE_FLOAT)
{
  opflags = PcodeOp::unary | PcodeOp::floatingpoint;
  behave = new OpBehaviorFloatAbs(trans);
}